

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void * yang_read_node(lys_module *module,lys_node *parent,lys_node **root,char *value,int nodetype,
                     int sizeof_struct)

{
  lys_node *plVar1;
  char *pcVar2;
  lys_node **pplVar3;
  LY_ERR *pLVar4;
  
  plVar1 = (lys_node *)calloc(1,(long)sizeof_struct);
  if (plVar1 == (lys_node *)0x0) {
    free(value);
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_node");
  }
  else {
    if ('\x02' < ly_log_level) {
      pcVar2 = strnodetype(nodetype);
      ly_log_dbg(LY_LDGYANG,"parsing %s statement \"%s\"",pcVar2,value);
    }
    pcVar2 = lydict_insert_zc(module->ctx,value);
    plVar1->name = pcVar2;
    plVar1->module = module;
    plVar1->nodetype = nodetype;
    pplVar3 = &parent->child;
    if (parent == (lys_node *)0x0) {
      pplVar3 = root;
    }
    if (*pplVar3 == (lys_node *)0x0) {
      *pplVar3 = plVar1;
      plVar1->prev = plVar1;
    }
    else {
      (*pplVar3)->prev->next = plVar1;
      (*pplVar3)->prev = plVar1;
    }
  }
  return plVar1;
}

Assistant:

void *
yang_read_node(struct lys_module *module, struct lys_node *parent, struct lys_node **root,
               char *value, int nodetype, int sizeof_struct)
{
    struct lys_node *node, **child;

    node = calloc(1, sizeof_struct);
    if (!node) {
        free(value);
        LOGMEM;
        return NULL;
    }
    LOGDBG(LY_LDGYANG, "parsing %s statement \"%s\"", strnodetype(nodetype), value);
    node->name = lydict_insert_zc(module->ctx, value);
    node->module = module;
    node->nodetype = nodetype;

    /* insert the node into the schema tree */
    child = (parent) ? &parent->child : root;
    if (*child) {
        (*child)->prev->next = node;
        (*child)->prev = node;
    } else {
        *child = node;
        node->prev = node;
    }
    return node;
}